

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O2

void test_inline_doc(void)

{
  char cVar1;
  undefined8 in_RAX;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar5;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar6;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar7;
  int32_t b;
  int32_t a;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  _b = in_RAX;
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo","{","b",uVar2,0xf,CONCAT44(uVar5,2),"a",uVar2,CONCAT44(uVar6,0xf),
                   CONCAT44(uVar7,1),"}",0);
  uVar3 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar2,"foo","{","a",uVar3,0xf,&a,"b",uVar3,0xf,&b,"}",0);
  if (cVar1 == '\0') {
    pcVar4 = 
    "BCON_EXTRACT ( bcon, \"foo\", \"{\", \"a\", BCONE_INT32 (a), \"b\", BCONE_INT32 (b), \"}\")";
    uVar2 = 0x165;
  }
  else if (a == 1) {
    if (b == 2) {
      bson_destroy(uVar2);
      return;
    }
    pcVar4 = "b == 2";
    uVar2 = 0x168;
  }
  else {
    pcVar4 = "a == 1";
    uVar2 = 0x167;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar2,"test_inline_doc",pcVar4);
  abort();
}

Assistant:

static void
test_inline_doc (void)
{
   bson_t bcon, expected, child;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);

   bson_append_utf8 (&child, "bar", -1, "baz", -1);
   bson_append_document (&expected, "foo", -1, &child);

   BCON_APPEND (&bcon, "foo", "{", "bar", "baz", "}");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&child);
}